

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

block_state deflate_slow(deflate_state *s,int flush)

{
  ushort uVar1;
  uInt uVar2;
  uInt uVar3;
  uInt uVar4;
  Posf *pPVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uInt uVar9;
  uint uVar10;
  uint uVar11;
  Bytef *pBVar12;
  uInt uVar13;
  IPos cur_match;
  bool bVar14;
  
  cur_match = 0;
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      if (flush == 0 && s->lookahead < 0x106) {
        return need_more;
      }
      if (s->lookahead == 0) {
        if (s->match_available != 0) {
          bVar7 = s->window[s->strstart - 1];
          uVar8 = s->last_lit;
          s->d_buf[uVar8] = 0;
          s->last_lit = uVar8 + 1;
          s->l_buf[uVar8] = bVar7;
          s->dyn_ltree[bVar7].fc.freq = s->dyn_ltree[bVar7].fc.freq + 1;
          s->match_available = 0;
        }
        uVar6 = s->block_start;
        if ((long)uVar6 < 0) {
          pBVar12 = (Bytef *)0x0;
        }
        else {
          pBVar12 = s->window + (uVar6 & 0xffffffff);
        }
        cm_zlib__tr_flush_block(s,(charf *)pBVar12,s->strstart - uVar6,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          return (uint)(flush == 4) * 2;
        }
        return (uint)(flush == 4) * 2 + block_done;
      }
    }
    if (2 < s->lookahead) {
      uVar8 = s->strstart;
      uVar11 = ((uint)s->window[uVar8 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
               s->hash_mask;
      s->ins_h = uVar11;
      pPVar5 = s->head;
      uVar1 = pPVar5[uVar11];
      cur_match = (IPos)uVar1;
      s->prev[s->w_mask & uVar8] = uVar1;
      pPVar5[uVar11] = (Posf)uVar8;
    }
    uVar8 = s->match_length;
    s->prev_length = uVar8;
    s->prev_match = s->match_start;
    s->match_length = 2;
    if (((cur_match != 0) && (uVar8 < s->max_lazy_match)) &&
       (uVar8 = s->strstart - cur_match, uVar8 <= s->w_size - 0x106)) {
      if ((s->strategy & 0xfffffffeU) == 2) {
        if (uVar8 == 1 && s->strategy == 3) {
          uVar9 = longest_match_fast(s,cur_match);
          goto LAB_00472b75;
        }
      }
      else {
        uVar9 = longest_match(s,cur_match);
LAB_00472b75:
        s->match_length = uVar9;
      }
      if ((s->match_length < 6) &&
         ((s->strategy == 1 || ((s->match_length == 3 && (0x1000 < s->strstart - s->match_start)))))
         ) {
        s->match_length = 2;
      }
    }
    uVar8 = s->prev_length;
    if ((uVar8 < 3) || (uVar8 < s->match_length)) {
      if (s->match_available == 0) {
        s->match_available = 1;
        s->strstart = s->strstart + 1;
        s->lookahead = s->lookahead - 1;
      }
      else {
        bVar7 = s->window[s->strstart - 1];
        uVar8 = s->last_lit;
        s->d_buf[uVar8] = 0;
        s->last_lit = uVar8 + 1;
        s->l_buf[uVar8] = bVar7;
        s->dyn_ltree[bVar7].fc.freq = s->dyn_ltree[bVar7].fc.freq + 1;
        if (s->last_lit == s->lit_bufsize - 1) {
          uVar6 = s->block_start;
          if ((long)uVar6 < 0) {
            pBVar12 = (Bytef *)0x0;
          }
          else {
            pBVar12 = s->window + (uVar6 & 0xffffffff);
          }
          cm_zlib__tr_flush_block(s,(charf *)pBVar12,s->strstart - uVar6,0);
          s->block_start = (ulong)s->strstart;
          flush_pending(s->strm);
        }
        s->strstart = s->strstart + 1;
        s->lookahead = s->lookahead - 1;
        if (s->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
    else {
      uVar11 = s->prev_match;
      uVar9 = s->strstart;
      uVar2 = s->lookahead;
      bVar7 = (char)uVar8 - 3;
      uVar8 = s->last_lit;
      s->d_buf[uVar8] = (short)uVar9 + (short)~uVar11;
      s->last_lit = uVar8 + 1;
      s->l_buf[uVar8] = bVar7;
      s->dyn_ltree[(ulong)""[bVar7] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar7] + 0x101].fc.freq + 1;
      uVar11 = (uVar9 + ~uVar11) - 1;
      uVar10 = uVar11 & 0xffff;
      uVar8 = (uVar10 >> 7) + 0x100;
      if (uVar10 < 0x100) {
        uVar8 = uVar11;
      }
      s->dyn_dtree[""[uVar8 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar8 & 0xffff]].fc.freq + 1;
      uVar3 = s->last_lit;
      uVar4 = s->lit_bufsize;
      uVar13 = s->prev_length;
      s->lookahead = (s->lookahead - uVar13) + 1;
      s->prev_length = uVar13 - 2;
      uVar13 = uVar13 - 3;
      uVar8 = s->strstart + 1;
      do {
        s->strstart = uVar8;
        if (uVar8 <= (uVar2 + uVar9) - 3) {
          uVar11 = ((uint)s->window[uVar8 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
                   s->hash_mask;
          s->ins_h = uVar11;
          pPVar5 = s->head;
          uVar1 = pPVar5[uVar11];
          cur_match = (IPos)uVar1;
          s->prev[s->w_mask & uVar8] = uVar1;
          pPVar5[uVar11] = (Posf)uVar8;
        }
        s->prev_length = uVar13;
        uVar8 = uVar8 + 1;
        bVar14 = uVar13 != 0;
        uVar13 = uVar13 - 1;
      } while (bVar14);
      s->match_available = 0;
      s->match_length = 2;
      s->strstart = uVar8;
      if (uVar3 == uVar4 - 1) {
        uVar6 = s->block_start;
        if ((long)uVar6 < 0) {
          pBVar12 = (Bytef *)0x0;
        }
        else {
          pBVar12 = s->window + (uVar6 & 0xffffffff);
        }
        cm_zlib__tr_flush_block(s,(charf *)pBVar12,uVar8 - uVar6,0);
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_slow(s, flush)
    deflate_state *s;
    int flush;
{
    IPos hash_head = NIL;    /* head of hash chain */
    int bflush;              /* set if current block must be flushed */

    /* Process the input block. */
    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         */
        s->prev_length = s->match_length, s->prev_match = s->match_start;
        s->match_length = MIN_MATCH-1;

        if (hash_head != NIL && s->prev_length < s->max_lazy_match &&
            s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            if (s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) {
                s->match_length = longest_match (s, hash_head);
            } else if (s->strategy == Z_RLE && s->strstart - hash_head == 1) {
                s->match_length = longest_match_fast (s, hash_head);
            }
            /* longest_match() or longest_match_fast() sets match_start */

            if (s->match_length <= 5 && (s->strategy == Z_FILTERED
#if TOO_FAR <= 32767
                || (s->match_length == MIN_MATCH &&
                    s->strstart - s->match_start > TOO_FAR)
#endif
                )) {

                /* If prev_match is also MIN_MATCH, match_start is garbage
                 * but we will ignore the current match anyway.
                 */
                s->match_length = MIN_MATCH-1;
            }
        }
        /* If there was a match at the previous step and the current
         * match is not better, output the previous match:
         */
        if (s->prev_length >= MIN_MATCH && s->match_length <= s->prev_length) {
            uInt max_insert = s->strstart + s->lookahead - MIN_MATCH;
            /* Do not insert strings in hash table beyond this. */

            check_match(s, s->strstart-1, s->prev_match, s->prev_length);

            _tr_tally_dist(s, s->strstart -1 - s->prev_match,
                           s->prev_length - MIN_MATCH, bflush);

            /* Insert in hash table all strings up to the end of the match.
             * strstart-1 and strstart are already inserted. If there is not
             * enough lookahead, the last two strings are not inserted in
             * the hash table.
             */
            s->lookahead -= s->prev_length-1;
            s->prev_length -= 2;
            do {
                if (++s->strstart <= max_insert) {
                    INSERT_STRING(s, s->strstart, hash_head);
                }
            } while (--s->prev_length != 0);
            s->match_available = 0;
            s->match_length = MIN_MATCH-1;
            s->strstart++;

            if (bflush) FLUSH_BLOCK(s, 0);

        } else if (s->match_available) {
            /* If there was no match at the previous position, output a
             * single literal. If there was a match but the current match
             * is longer, truncate the previous match to a single literal.
             */
            Tracevv((stderr,"%c", s->window[s->strstart-1]));
            _tr_tally_lit(s, s->window[s->strstart-1], bflush);
            if (bflush) {
                FLUSH_BLOCK_ONLY(s, 0);
            }
            s->strstart++;
            s->lookahead--;
            if (s->strm->avail_out == 0) return need_more;
        } else {
            /* There is no previous match to compare with, wait for
             * the next step to decide.
             */
            s->match_available = 1;
            s->strstart++;
            s->lookahead--;
        }
    }
    Assert (flush != Z_NO_FLUSH, "no flush?");
    if (s->match_available) {
        Tracevv((stderr,"%c", s->window[s->strstart-1]));
        _tr_tally_lit(s, s->window[s->strstart-1], bflush);
        s->match_available = 0;
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}